

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PelcoD.cpp
# Opt level: O3

void __thiscall
PelcoD::moveTopOnce(PelcoD *this,int panSpeed,int tiltSpeed,
                   vector<char,_std::allocator<char>_> *mess)

{
  pointer pcVar1;
  pointer pcVar2;
  value_type *__val;
  pointer pcVar3;
  
  pcVar3 = (pointer)operator_new(9);
  *pcVar3 = '\0';
  pcVar3[1] = '\0';
  pcVar3[2] = '\0';
  pcVar3[3] = '\0';
  pcVar3[4] = '\0';
  pcVar3[5] = '\0';
  pcVar3[6] = '\0';
  pcVar3[7] = '\0';
  pcVar3[8] = '\0';
  pcVar1 = (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pcVar2 = (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
           _M_end_of_storage;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start =
       pcVar3;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_finish
       = pcVar3 + 9;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pcVar3 + 9;
  if (pcVar1 != (pointer)0x0) {
    operator_delete(pcVar1,(long)pcVar2 - (long)pcVar1);
    pcVar3 = (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_start;
  }
  *pcVar3 = -0x7f;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [1] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [2] = '\x06';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [3] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [4] = ((char)(uint)((ulong)((long)panSpeed * 0x80808081) >> 0x27) -
        (char)((long)panSpeed * 0x80808081 >> 0x3f)) + (char)panSpeed;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [5] = ((char)(uint)((ulong)((long)tiltSpeed * 0x80808081) >> 0x27) -
        (char)((long)tiltSpeed * 0x80808081 >> 0x3f)) + (char)tiltSpeed;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [6] = '\x03';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [7] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [8] = -1;
  return;
}

Assistant:

void PelcoD::moveTopOnce(int panSpeed, int tiltSpeed, std::vector<char> &mess)
{
	mess = std::vector<char>(9);
	mess[0] = 0x81;
	mess[1] = 0x01;
	mess[2] = 0x06;
	mess[3] = 0x01;
	mess[4] = panSpeed % 255;
	mess[5] = tiltSpeed % 255;
	mess[6] = 0x03;
	mess[7] = 0x01;
	mess[8] = 0xff;
}